

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_NodeStore_insert(UA_NodeStore *ns,UA_Node *node)

{
  uint uVar1;
  ulong uVar2;
  UA_Boolean UVar3;
  UA_StatusCode UVar4;
  uint uVar5;
  UA_NodeStoreEntry **ppUVar6;
  uint uVar7;
  UA_UInt32 UVar8;
  uint uVar9;
  undefined1 auStack_48 [8];
  UA_NodeId tempNodeid;
  
  if ((ns->size * 3 <= ns->count << 2) && (UVar4 = expand(ns), UVar4 != 0)) {
    return 0x80020000;
  }
  uVar2._0_2_ = (node->nodeId).namespaceIndex;
  uVar2._2_2_ = *(undefined2 *)&(node->nodeId).field_0x2;
  uVar2._4_4_ = (node->nodeId).identifierType;
  tempNodeid._0_8_ = (node->nodeId).identifier.string.length;
  tempNodeid.identifier.string.length = (size_t)(node->nodeId).identifier.string.data;
  auStack_48 = (undefined1  [8])(uVar2 & 0xffffffffffff0000);
  UVar3 = UA_NodeId_isNull((UA_NodeId *)auStack_48);
  if (UVar3) {
    if ((node->nodeId).namespaceIndex == 0) {
      (node->nodeId).namespaceIndex = 1;
    }
    uVar1 = ns->size;
    UVar8 = ns->count + 1;
    uVar7 = UVar8 % (uVar1 - 2);
    (node->nodeId).identifier.numeric = UVar8;
    ppUVar6 = findSlot(ns,&node->nodeId);
    if (ppUVar6 == (UA_NodeStoreEntry **)0x0) {
      do {
        uVar9 = UVar8 + uVar7 + 1;
        uVar5 = uVar1;
        if (uVar9 < uVar1) {
          uVar5 = 0;
        }
        UVar8 = uVar9 - uVar5;
        (node->nodeId).identifier.numeric = UVar8;
        ppUVar6 = findSlot(ns,&node->nodeId);
      } while (ppUVar6 == (UA_NodeStoreEntry **)0x0);
    }
  }
  else {
    ppUVar6 = findSlot(ns,&node->nodeId);
    if (ppUVar6 == (UA_NodeStoreEntry **)0x0) {
      UA_NodeStore_deleteNode(node);
      return 0x805e0000;
    }
  }
  *ppUVar6 = (UA_NodeStoreEntry *)&node[-1].references;
  ns->count = ns->count + 1;
  return 0;
}

Assistant:

UA_StatusCode
UA_NodeStore_insert(UA_NodeStore *ns, UA_Node *node) {
    if(ns->size * 3 <= ns->count * 4) {
        if(expand(ns) != UA_STATUSCODE_GOOD)
            return UA_STATUSCODE_BADINTERNALERROR;
    }

    UA_NodeId tempNodeid;
    tempNodeid = node->nodeId;
    tempNodeid.namespaceIndex = 0;
    UA_NodeStoreEntry **entry;
    if(UA_NodeId_isNull(&tempNodeid)) {
        /* create a random nodeid */
        if(node->nodeId.namespaceIndex == 0)
            node->nodeId.namespaceIndex = 1;
        UA_UInt32 identifier = ns->count+1; // start value
        UA_UInt32 size = ns->size;
        UA_UInt32 increase = mod2(identifier, size);
        while(true) {
            node->nodeId.identifier.numeric = identifier;
            entry = findSlot(ns, &node->nodeId);
            if(entry)
                break;
            identifier += increase;
            if(identifier >= size)
                identifier -= size;
        }
    } else {
        entry = findSlot(ns, &node->nodeId);
        if(!entry) {
            UA_NodeStore_deleteNode(node);
            return UA_STATUSCODE_BADNODEIDEXISTS;
        }
    }

    *entry = container_of(node, UA_NodeStoreEntry, node);
    ++ns->count;
    UA_assert(&(*entry)->node == node);
    return UA_STATUSCODE_GOOD;
}